

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

BigInteger * __thiscall rapidjson::internal::BigInteger::operator+=(BigInteger *this,uint64_t u)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->digits_[0];
  uVar3 = u + uVar1;
  this->digits_[0] = uVar3;
  uVar2 = 0;
  while( true ) {
    if (this->count_ - 1 <= uVar2) {
      if (this->digits_[this->count_ - 1] < uVar1) {
        PushBack(this,1);
      }
      return this;
    }
    if (uVar1 <= uVar3) break;
    uVar1 = this->digits_[uVar2 + 1];
    uVar3 = uVar1 + 1;
    this->digits_[uVar2 + 1] = uVar3;
    uVar2 = uVar2 + 1;
  }
  return this;
}

Assistant:

BigInteger& operator+=(uint64_t u) {
        Type backup = digits_[0];
        digits_[0] += u;
        for (size_t i = 0; i < count_ - 1; i++) {
            if (digits_[i] >= backup)
                return *this; // no carry
            backup = digits_[i + 1];
            digits_[i + 1] += 1;
        }

        // Last carry
        if (digits_[count_ - 1] < backup)
            PushBack(1);

        return *this;
    }